

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

string * __thiscall
slang::TimeScaleValue::toString_abi_cxx11_(string *__return_storage_ptr__,TimeScaleValue *this)

{
  TimeScaleMagnitude TVar1;
  string *__str;
  size_type __n;
  
  TVar1 = this->magnitude;
  __n = 1;
  if (9 < TVar1) {
    __n = (size_type)(3 - (TVar1 < Hundred));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,__n,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p,(uint)__n,(uint)TVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,*(char **)(&DAT_006dcc60 + (long)(char)this->unit * 8),
             *(size_type *)(&DAT_0055da68 + (long)(char)this->unit * 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TimeScaleValue::toString() const {
    std::string result = std::to_string(int(magnitude));
    result.append(timeUnitToSuffix(unit));
    return result;
}